

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfMultiPartOutputFile.cpp
# Opt level: O2

void __thiscall Imf_3_4::MultiPartOutputFile::Data::~Data(Data *this)

{
  OStream *pOVar1;
  pointer ppOVar2;
  OutputPartData *this_00;
  size_t i;
  ulong uVar3;
  
  if ((this->deleteStream == true) &&
     (pOVar1 = (this->super_OutputStreamMutex).os, pOVar1 != (OStream *)0x0)) {
    (*pOVar1->_vptr_OStream[1])();
  }
  for (uVar3 = 0;
      ppOVar2 = (this->parts).
                super__Vector_base<Imf_3_4::OutputPartData_*,_std::allocator<Imf_3_4::OutputPartData_*>_>
                ._M_impl.super__Vector_impl_data._M_start,
      uVar3 < (ulong)((long)(this->parts).
                            super__Vector_base<Imf_3_4::OutputPartData_*,_std::allocator<Imf_3_4::OutputPartData_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)ppOVar2 >> 3);
      uVar3 = uVar3 + 1) {
    this_00 = ppOVar2[uVar3];
    if (this_00 != (OutputPartData *)0x0) {
      Header::~Header(&this_00->header);
    }
    operator_delete(this_00,0x60);
  }
  std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::~vector(&this->_headers);
  std::
  _Rb_tree<int,_std::pair<const_int,_Imf_3_4::GenericOutputFile_*>,_std::_Select1st<std::pair<const_int,_Imf_3_4::GenericOutputFile_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_Imf_3_4::GenericOutputFile_*>_>_>
  ::~_Rb_tree(&(this->_outputFiles)._M_t);
  std::_Vector_base<Imf_3_4::OutputPartData_*,_std::allocator<Imf_3_4::OutputPartData_*>_>::
  ~_Vector_base(&(this->parts).
                 super__Vector_base<Imf_3_4::OutputPartData_*,_std::allocator<Imf_3_4::OutputPartData_*>_>
               );
  return;
}

Assistant:

~Data ()
    {
        if (deleteStream) delete os;

        for (size_t i = 0; i < parts.size (); i++)
            delete parts[i];
    }